

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddNumberError(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                 *this,ValidateErrorCode code,ValueType *actual,SValue *expected,
                _func_ValueType_ptr *exclusive)

{
  _func_ValueType_ptr *rhs;
  SValue *value;
  StringRefType *pSVar1;
  CrtAllocator *pCVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar3;
  ValueType *rhs_00;
  ValueType *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_80 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_60;
  GenericStringRef<char> local_50;
  GenericStringRef<char> local_40;
  _func_ValueType_ptr *local_30;
  _func_ValueType_ptr *exclusive_local;
  SValue *expected_local;
  ValueType *actual_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *pGStack_10;
  ValidateErrorCode code_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  this_00 = &this->currentError_;
  local_30 = exclusive;
  exclusive_local = (_func_ValueType_ptr *)expected;
  expected_local = actual;
  actual_local._4_4_ = code;
  pGStack_10 = this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetObject(this_00);
  pSVar1 = GetActualString();
  GenericStringRef<char>::GenericStringRef(&local_40,pSVar1);
  value = expected_local;
  pCVar2 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (this_00,&local_40,value,pCVar2);
  pSVar1 = GetExpectedString();
  GenericStringRef<char>::GenericStringRef(&local_50,pSVar1);
  rhs = exclusive_local;
  pCVar2 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericValue<rapidjson::CrtAllocator>
            (&local_60,(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)rhs,pCVar2,
             false);
  pGVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_60);
  pCVar2 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (this_00,&local_50,pGVar3,pCVar2);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_60);
  if (local_30 != (_func_ValueType_ptr *)0x0) {
    rhs_00 = (*local_30)();
    pCVar2 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
    GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)local_80,rhs_00,pCVar2
               ,false);
    pGVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(local_80);
    pCVar2 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember<bool>
              (&this->currentError_,pGVar3,true,pCVar2);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(local_80);
  }
  AddCurrentError(this,actual_local._4_4_,false);
  return;
}

Assistant:

void AddNumberError(const ValidateErrorCode code, ValueType& actual, const SValue& expected,
        const typename SchemaType::ValueType& (*exclusive)() = 0) {
        currentError_.SetObject();
        currentError_.AddMember(GetActualString(), actual, GetStateAllocator());
        currentError_.AddMember(GetExpectedString(), ValueType(expected, GetStateAllocator()).Move(), GetStateAllocator());
        if (exclusive)
            currentError_.AddMember(ValueType(exclusive(), GetStateAllocator()).Move(), true, GetStateAllocator());
        AddCurrentError(code);
    }